

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_smcard.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  void *__ptr;
  FILE *__stream;
  size_t sVar5;
  int rebate;
  int max_units;
  int multiplier;
  uint8_t *load_buffer;
  dlog_mt_scard_parm_table_t *ptable;
  int ret;
  int index;
  FILE *ostream;
  FILE *instream;
  char **argv_local;
  int argc_local;
  
  _ret = (FILE *)0x0;
  ptable._0_4_ = 0;
  if (argc < 2) {
    printf("Usage:\n\tmm_smcard mm_table_%02x.bin [outputfile.bin]\n",0x5d);
    argv_local._4_4_ = -1;
  }
  else {
    pcVar4 = table_to_string(']');
    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar4,0x5d);
    __ptr = calloc(1,0xe1);
    if (__ptr == (void *)0x0) {
      printf("Failed to allocate %zu bytes.\n",0xe1);
      argv_local._4_4_ = -0xc;
    }
    else {
      __stream = fopen(argv[1],"rb");
      if (__stream == (FILE *)0x0) {
        printf("Error opening %s\n",argv[1]);
        free(__ptr);
        argv_local._4_4_ = -2;
      }
      else {
        iVar3 = mm_validate_table_fsize(']',(FILE *)__stream,0xe0);
        if (iVar3 == 0) {
          sVar5 = fread((void *)((long)__ptr + 1),0xe0,1,__stream);
          if (sVar5 == 1) {
            fclose(__stream);
            printf(
                  "+--------------------------+\n| Idx | DES Key            |\n+--------------------------+\n"
                  );
            for (ptable._4_4_ = 0; (int)ptable._4_4_ < 0x14; ptable._4_4_ = ptable._4_4_ + 1) {
              printf("|  %2d | 0x%016lx |\n",(ulong)ptable._4_4_,
                     *(undefined8 *)((long)__ptr + (long)(int)ptable._4_4_ * 8 + 1));
            }
            printf("+--------------------------+\n");
            printf(
                  "\n+-----+------+-----------+\n| Idx | Mult | Max Units |\n+-----+------+-----------+\n"
                  );
            for (ptable._4_4_ = 0; (int)ptable._4_4_ < 0xf; ptable._4_4_ = ptable._4_4_ + 1) {
              uVar2 = htons(*(uint16_t *)((long)__ptr + (long)(int)ptable._4_4_ * 2 + 0xa1));
              uVar1 = mult_lut[(int)(uVar2 & 3)];
              uVar2 = htons(*(uint16_t *)((long)__ptr + (long)(int)ptable._4_4_ * 2 + 0xa1));
              printf("|  %2d |  %2d  |     %5d |\n",(ulong)ptable._4_4_,(ulong)uVar1,
                     (ulong)(uint)((int)(uint)uVar2 >> 2));
            }
            printf("+------------------------+\n");
            printf(
                  "\n+-----+-------------------------------+---------+\n| Idx | Rebate Type                   | Rebate  |\n+-----+-------------------------------+---------+\n"
                  );
            for (ptable._4_4_ = 0; (int)ptable._4_4_ < 0xe; ptable._4_4_ = ptable._4_4_ + 1) {
              printf("|  %2d | %s | $%6.2f |\n",
                     (double)((float)*(ushort *)((long)__ptr + (long)(int)ptable._4_4_ * 2 + 0xbf) /
                             100.0),(ulong)ptable._4_4_,str_smcard_rebate[(int)ptable._4_4_]);
            }
            printf("+-----------------------------------------------+\n");
            if ((argc < 3) || (_ret = fopen(argv[2],"wb"), _ret != (FILE *)0x0)) {
              *(undefined8 *)((long)__ptr + 1) = 0xffffffffffffffff;
              *(undefined8 *)((long)__ptr + 9) = 0;
              *(undefined8 *)((long)__ptr + 0x11) = 0x7f7f7f7f7f7f7f7f;
              *(undefined8 *)((long)__ptr + 0x19) = 0xfefefefefefefefe;
              uVar2 = htons(0x51);
              *(uint16_t *)((long)__ptr + 0xa1) = uVar2;
              uVar2 = htons(0xf1);
              *(uint16_t *)((long)__ptr + 0xa3) = uVar2;
              uVar2 = htons(0x1a5);
              *(uint16_t *)((long)__ptr + 0xa5) = uVar2;
              uVar2 = htons(0x371);
              *(uint16_t *)((long)__ptr + 0xa7) = uVar2;
              uVar2 = htons(0x6e1);
              *(uint16_t *)((long)__ptr + 0xa9) = uVar2;
              uVar2 = htons(0xaa1);
              *(uint16_t *)((long)__ptr + 0xab) = uVar2;
              uVar2 = htons(1);
              *(uint16_t *)((long)__ptr + 0xad) = uVar2;
              uVar2 = htons(0x191);
              *(uint16_t *)((long)__ptr + 0xaf) = uVar2;
              uVar2 = htons(0x321);
              *(uint16_t *)((long)__ptr + 0xb1) = uVar2;
              uVar2 = htons(0x641);
              *(uint16_t *)((long)__ptr + 0xb3) = uVar2;
              if (_ret != (FILE *)0x0) {
                printf("\nWriting new table to %s\n",argv[2]);
                sVar5 = fwrite((void *)((long)__ptr + 1),0xe0,1,_ret);
                if (sVar5 != 1) {
                  printf("Error writing output file %s\n",argv[2]);
                  ptable._0_4_ = -5;
                }
                fclose(_ret);
              }
              free(__ptr);
              argv_local._4_4_ = (int)ptable;
            }
            else {
              printf("Error opening output file %s for write.\n",argv[2]);
              free(__ptr);
              argv_local._4_4_ = -2;
            }
          }
          else {
            pcVar4 = table_to_string(']');
            printf("Error reading %s table.\n",pcVar4);
            free(__ptr);
            fclose(__stream);
            argv_local._4_4_ = -5;
          }
        }
        else {
          free(__ptr);
          fclose(__stream);
          argv_local._4_4_ = -5;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   ret = 0;

    dlog_mt_scard_parm_table_t *ptable;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_smcard mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_scard_parm_table_t *)calloc(1, sizeof(dlog_mt_scard_parm_table_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_scard_parm_table_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_scard_parm_table_t) - 1) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)ptable) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_scard_parm_table_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+--------------------------+\n" \
           "| Idx | DES Key            |\n" \
           "+--------------------------+\n");

    for (index = 0; index < SC_DES_KEY_MAX; index++) {
        printf("|  %2d | 0x%016" PRIx64 " |\n",
               index,
               LE64(ptable->des_key[index]));
    }
    printf("+--------------------------+\n");

    printf("\n+-----+------+-----------+\n" \
           "| Idx | Mult | Max Units |\n"   \
           "+-----+------+-----------+\n");

    for (index = 0; index < SC_MULT_MAX_UNIT_MAX; index++) {
        int multiplier = mult_lut[(htons(LE16(ptable->mult_max_unit[index])) & SC_MULT_MASK)];
        int max_units  = htons(LE16(ptable->mult_max_unit[index])) >> SC_MAX_UNIT_SHIFT;

        printf("|  %2d |  %2d  |     %5d |\n", index, multiplier, max_units);
    }

    printf("+------------------------+\n");

    printf("\n+-----+-------------------------------+---------+\n" \
           "| Idx | Rebate Type                   | Rebate  |\n"   \
           "+-----+-------------------------------+---------+\n");

    for (index = 0; index < SC_REBATE_MAX; index++) {
        int rebate = LE16(ptable->rebates[index]);

        printf("|  %2d | %s | $%6.2f |\n", index, str_smcard_rebate[index], (float)rebate / 100);
    }

    printf("+-----------------------------------------------+\n");

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            free(ptable);
            return -ENOENT;
        }
    }

    /* Modify SMCARD table */
    ptable->des_key[0] = LE64(0xFFFFFFFFFFFFFFFFULL);
    ptable->des_key[1] = LE64(0ULL);
    ptable->des_key[2] = LE64(0x7F7F7F7F7F7F7F7FULL);
    ptable->des_key[3] = LE64(0xFEFEFEFEFEFEFEFEULL);

    ptable->mult_max_unit[0] = htons(LE16(20  << 2 | 0x01));   // 20
    ptable->mult_max_unit[1] = htons(LE16(60  << 2 | 0x01));   // 60
    ptable->mult_max_unit[2] = htons(LE16(105 << 2 | 0x01));   // 105
    ptable->mult_max_unit[3] = htons(LE16(220 << 2 | 0x01));   // 220
    ptable->mult_max_unit[4] = htons(LE16(440 << 2 | 0x01));   // 440
    ptable->mult_max_unit[5] = htons(LE16(680 << 2 | 0x01));   // 680
    ptable->mult_max_unit[6] = htons(LE16(0   << 2 | 0x01));   // 0
    ptable->mult_max_unit[7] = htons(LE16(100 << 2 | 0x01));   // 100
    ptable->mult_max_unit[8] = htons(LE16(200 << 2 | 0x01));   // 200
    ptable->mult_max_unit[9] = htons(LE16(400 << 2 | 0x01));   // 400

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_scard_parm_table_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    free(ptable);

    return ret;
}